

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
          (CodedOutputStream *this,string_view str,uint8_t *target)

{
  ulong uVar1;
  uint uVar2;
  byte *pbVar3;
  
  pbVar3 = (byte *)str._M_str;
  if ((ulong)this >> 0x20 != 0) {
    WriteStringWithSizeToArray();
  }
  if (this < (CodedOutputStream *)0x80) {
    uVar1 = (ulong)this & 0xffffffff;
  }
  else {
    uVar1 = (ulong)this & 0xffffffff;
    do {
      uVar2 = (uint)uVar1;
      *pbVar3 = (byte)uVar1 | 0x80;
      uVar1 = uVar1 >> 7;
      pbVar3 = pbVar3 + 1;
    } while (0x3fff < uVar2);
  }
  *pbVar3 = (byte)uVar1;
  memcpy(pbVar3 + 1,(void *)str._M_len,(size_t)this);
  return pbVar3 + (long)(int)this + 1;
}

Assistant:

uint8_t* CodedOutputStream::WriteStringWithSizeToArray(absl::string_view str,
                                                       uint8_t* target) {
  ABSL_DCHECK_LE(str.size(), std::numeric_limits<uint32_t>::max());
  target = WriteVarint32ToArray(str.size(), target);
  return WriteStringToArray(str, target);
}